

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

void __thiscall FScanner::OpenLumpNum(FScanner *this,int lump)

{
  FMemLump mem;
  undefined1 auStack_28 [16];
  
  Close(this);
  FWadCollection::ReadLump((FWadCollection *)auStack_28,0x1c6a4b0);
  FString::AttachToOther((FString *)(auStack_28 + 8),(FString *)auStack_28);
  FString::operator=(&this->ScriptBuffer,(FString *)(auStack_28 + 8));
  FString::~FString((FString *)(auStack_28 + 8));
  FMemLump::~FMemLump((FMemLump *)auStack_28);
  FWadCollection::GetLumpFullPath((FWadCollection *)auStack_28,0x1c6a4b0);
  FString::operator=(&this->ScriptName,(FString *)auStack_28);
  FString::~FString((FString *)auStack_28);
  this->LumpNum = lump;
  PrepareScript(this);
  return;
}

Assistant:

void FScanner :: OpenLumpNum (int lump)
{
	Close ();
	{
		FMemLump mem = Wads.ReadLump(lump);
		ScriptBuffer = mem.GetString();
	}
	ScriptName = Wads.GetLumpFullPath(lump);
	LumpNum = lump;
	PrepareScript ();
}